

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::check_always_sensitivity(Generator *top)

{
  undefined1 local_58 [8];
  SensitivityVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  SensitivityVisitor::SensitivityVisitor((SensitivityVisitor *)local_58);
  IRVisitor::visit_root
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  SensitivityVisitor::~SensitivityVisitor((SensitivityVisitor *)local_58);
  return;
}

Assistant:

void check_always_sensitivity(Generator* top) {
    SensitivityVisitor visitor;
    visitor.visit_root(top);
}